

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O3

void __thiscall hiberlite::real_bean<A>::~real_bean(real_bean<A> *this)

{
  int *piVar1;
  A *pAVar2;
  pointer ppVar3;
  pointer pcVar4;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar5;
  
  save(this);
  pAVar2 = this->obj;
  if (pAVar2 != (A *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&(pAVar2->mm)._M_t);
    std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>::~vector
              (&pAVar2->v);
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree(&(pAVar2->seti)._M_t);
    ppVar3 = (pAVar2->vi).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (ppVar3 != (pointer)0x0) {
      operator_delete(ppVar3);
    }
    pcVar4 = (pAVar2->s)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(pAVar2->s).field_2) {
      operator_delete(pcVar4);
    }
  }
  operator_delete(pAVar2);
  (this->key).con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
  psVar5 = (this->key).con.res;
  if (psVar5 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &psVar5->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*psVar5->_vptr_shared_cnt_obj_pair[1])();
      return;
    }
  }
  return;
}

Assistant:

real_bean<C>::~real_bean()
{
	save();
	delete obj;
}